

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O3

ForNonContainerNonPointer<my_error,_std::string> * __thiscall
lest::to_string<__lest_function__1822(lest::env&)::my_error>
          (ForNonContainerNonPointer<my_error,_std::string> *__return_storage_ptr__,lest *this,
          my_error *item)

{
  string local_38;
  int local_14;
  
  local_14 = (int)this;
  make_value_string<int>(&local_38,&local_14);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p == &local_38.field_2) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = local_38.field_2._M_local_buf[0];
    (__return_storage_ptr__->field_2)._M_local_buf[7] = local_38.field_2._M_local_buf[7];
    *(undefined2 *)((long)&__return_storage_ptr__->field_2 + 5) =
         local_38.field_2._M_allocated_capacity._5_2_;
    *(undefined4 *)((long)&__return_storage_ptr__->field_2 + 1) =
         local_38.field_2._M_allocated_capacity._1_4_;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_38.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_38._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT17(local_38.field_2._M_local_buf[7],
                  CONCAT25(local_38.field_2._M_allocated_capacity._5_2_,
                           CONCAT41(local_38.field_2._M_allocated_capacity._1_4_,
                                    local_38.field_2._M_local_buf[0])));
  }
  __return_storage_ptr__->_M_string_length = local_38._M_string_length;
  return (ForNonContainerNonPointer<my_error,_std::string> *)local_38._M_string_length;
}

Assistant:

auto to_string( T const & item ) -> ForNonContainerNonPointer<T, std::string>
{
    return make_string( item );
}